

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_event_detected_falling(APITests *this)

{
  initializer_list<std::pair<int,_bool>_> __l;
  initializer_list<std::pair<int,_bool>_> __l_00;
  bool in_stack_0000014e;
  bool in_stack_0000014f;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *in_stack_00000150;
  Edge in_stack_00000158;
  int in_stack_0000015c;
  APITests *in_stack_00000160;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *in_stack_ffffffffffffff10;
  pair<int,_bool> *this_00;
  allocator_type *__a;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *this_01;
  pair<int,_bool> *this_02;
  undefined1 *puVar1;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  pair<int,_bool> local_b0;
  pair<int,_bool> local_a8;
  pair<int,_bool> local_a0;
  pair<int,_bool> local_98;
  pair<int,_bool> *local_90;
  undefined8 local_88;
  undefined1 local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  pair<int,_bool> local_50;
  pair<int,_bool> local_48;
  pair<int,_bool> local_40;
  pair<int,_bool> local_38;
  pair<int,_bool> *local_30;
  undefined8 local_28;
  
  local_51 = true;
  __a = (allocator_type *)&GPIO::LOW;
  this_02 = &local_50;
  std::pair<int,_bool>::pair<bool,_true>(this_02,&GPIO::LOW,&local_51);
  local_52 = false;
  this_01 = (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&GPIO::HIGH;
  std::pair<int,_bool>::pair<bool,_true>(&local_48,&GPIO::HIGH,&local_52);
  local_53 = true;
  std::pair<int,_bool>::pair<bool,_true>(&local_40,(int *)__a,&local_53);
  local_54 = false;
  std::pair<int,_bool>::pair<bool,_true>(&local_38,(int *)this_01,&local_54);
  local_28 = 4;
  puVar1 = &local_55;
  local_30 = this_02;
  std::allocator<std::pair<int,_bool>_>::allocator((allocator<std::pair<int,_bool>_> *)0x146092);
  __l._M_len = (size_type)puVar1;
  __l._M_array = this_02;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector(this_01,__l,__a)
  ;
  _test_events(in_stack_00000160,in_stack_0000015c,in_stack_00000158,in_stack_00000150,
               in_stack_0000014f,in_stack_0000014e);
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
            (in_stack_ffffffffffffff10);
  std::allocator<std::pair<int,_bool>_>::~allocator((allocator<std::pair<int,_bool>_> *)0x1460f4);
  local_b1 = false;
  this_00 = &local_b0;
  std::pair<int,_bool>::pair<bool,_true>(this_00,&GPIO::HIGH,&local_b1);
  local_b2 = true;
  std::pair<int,_bool>::pair<bool,_true>(&local_a8,&GPIO::LOW,&local_b2);
  local_b3 = false;
  std::pair<int,_bool>::pair<bool,_true>(&local_a0,&GPIO::HIGH,&local_b3);
  local_b4 = true;
  std::pair<int,_bool>::pair<bool,_true>(&local_98,&GPIO::LOW,&local_b4);
  local_88 = 4;
  local_90 = this_00;
  std::allocator<std::pair<int,_bool>_>::allocator((allocator<std::pair<int,_bool>_> *)0x146190);
  __l_00._M_len = (size_type)puVar1;
  __l_00._M_array = this_02;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            (this_01,__l_00,__a);
  _test_events(in_stack_00000160,in_stack_0000015c,in_stack_00000158,in_stack_00000150,
               in_stack_0000014f,in_stack_0000014e);
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)this_00);
  std::allocator<std::pair<int,_bool>_>::~allocator((allocator<std::pair<int,_bool>_> *)0x1461ed);
  return;
}

Assistant:

void test_event_detected_falling()
    {
        _test_events(
            GPIO::HIGH, 
            GPIO::FALLING, 
            { 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}
            }, 
            false, 
            false
        );
        _test_events(
            GPIO::LOW, 
            GPIO::FALLING, 
            { 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false},
                {GPIO::LOW, true} 
            }, 
            true, 
            false
        );
    }